

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

ssize_t zt_cstr_rupto(char *s,ssize_t i,ssize_t j,char *set)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    lVar6 = 0;
    lVar5 = 0;
  }
  else {
    lVar4 = (i >> 0x3f & sVar2) + i;
    if ((long)sVar2 <= lVar4) {
      lVar4 = sVar2 - 1;
    }
    lVar5 = (j >> 0x3f & sVar2) + j;
    if ((long)sVar2 <= lVar5) {
      lVar5 = sVar2 - 1;
    }
    lVar6 = lVar5;
    if (lVar5 < lVar4) {
      lVar6 = lVar4;
    }
    if (lVar4 < lVar5) {
      lVar5 = lVar4;
    }
  }
  do {
    pcVar3 = strchr(set,(int)s[lVar6]);
    if (pcVar3 != (char *)0x0) {
      return lVar6;
    }
    bVar1 = lVar5 < lVar6;
    lVar6 = lVar6 + -1;
  } while (bVar1);
  return -1;
}

Assistant:

ssize_t
zt_cstr_rupto(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(set);

    CONVERT(s, i, j);
    for (; j >= i; j--) {
        if (strchr(set, s[j])) {
            return j;
        }
    }

    return -1;
}